

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::TupleDataTemplatedWithinCollectionScatter<duckdb::string_t>
               (Vector *param_1,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *param_5,Vector *param_6,Vector *heap_locations,
               idx_t param_8,UnifiedVectorFormat *list_data,
               vector<duckdb::TupleDataScatterFunction,_true> *param_10)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  byte bVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_char> *pTVar7;
  long lVar8;
  long lVar9;
  _Head_base<0UL,_unsigned_char_*,_false> _Var10;
  ulong uVar11;
  idx_t iVar12;
  long *plVar13;
  data_ptr_t src;
  idx_t iVar14;
  ulong uVar15;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true> local_90;
  ulong local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  SelectionVector *local_60;
  idx_t local_58;
  SelectionVector *local_50;
  long local_48;
  SelectionVector *local_40;
  ulong local_38;
  
  if (append_count != 0) {
    local_50 = list_data->sel;
    pdVar1 = list_data->data;
    local_40 = (source_format->unified).sel;
    pdVar2 = (source_format->unified).data;
    pdVar3 = heap_locations->data;
    iVar14 = 0;
    local_60 = append_sel;
    local_58 = append_count;
    do {
      iVar12 = iVar14;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)append_sel->sel_vector[iVar14];
      }
      if (local_50->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)local_50->sel_vector[iVar12];
      }
      puVar4 = (list_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)) {
        uVar15 = *(ulong *)(pdVar1 + iVar12 * 0x10 + 8);
        if (uVar15 != 0) {
          _Var10._M_head_impl = *(uchar **)(pdVar3 + iVar14 * 8);
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_90.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80 = uVar15;
          if (_Var10._M_head_impl == (uchar *)0x0) {
            local_38 = uVar15;
            make_buffer<duckdb::TemplatedValidityData<unsigned_char>,unsigned_long&>
                      ((duckdb *)&local_78,&local_38);
            p_Var6 = p_Stack_70;
            local_90.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_78;
            this._M_pi = local_90.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            local_78 = (element_type *)0x0;
            p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_90.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
               p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_true>::operator->
                               (&local_90);
            _Var10._M_head_impl =
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          lVar8 = (uVar15 + 7 >> 3) - 1;
          if (lVar8 != 0) {
            lVar9 = 0;
            do {
              _Var10._M_head_impl[lVar9] = 0xff;
              lVar9 = lVar9 + 1;
            } while (lVar8 != lVar9);
          }
          plVar13 = (long *)(pdVar1 + iVar12 * 0x10);
          _Var10._M_head_impl[lVar8] =
               _Var10._M_head_impl[lVar8] | -((uVar15 & 7) == 0) | ~(-1 << ((byte)uVar15 & 7));
          lVar8 = plVar13[1];
          local_48 = (lVar8 + 7U >> 3) + *(long *)(pdVar3 + iVar14 * 8);
          *(long *)(pdVar3 + iVar14 * 8) = local_48 + lVar8 * 4;
          if (lVar8 != 0) {
            uVar15 = 0;
            do {
              uVar11 = *plVar13 + uVar15;
              if (local_40->sel_vector != (sel_t *)0x0) {
                uVar11 = (ulong)local_40->sel_vector[uVar11];
              }
              puVar4 = (source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                       validity_mask;
              if ((puVar4 == (unsigned_long *)0x0) ||
                 ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)) {
                lVar8 = uVar11 * 0x10;
                *(undefined4 *)(local_48 + uVar15 * 4) = *(undefined4 *)(pdVar2 + lVar8);
                if ((ulong)*(uint *)(pdVar2 + lVar8) < 0xd) {
                  src = pdVar2 + lVar8 + 4;
                }
                else {
                  src = *(data_ptr_t *)(pdVar2 + lVar8 + 8);
                }
                FastMemcpy(*(void **)(pdVar3 + iVar14 * 8),src,(ulong)*(uint *)(pdVar2 + lVar8));
                *(ulong *)(pdVar3 + iVar14 * 8) =
                     *(long *)(pdVar3 + iVar14 * 8) + (ulong)*(uint *)(pdVar2 + lVar8);
              }
              else {
                bVar5 = (byte)uVar15 & 7;
                _Var10._M_head_impl[uVar15 >> 3] =
                     _Var10._M_head_impl[uVar15 >> 3] & (-2 << bVar5 | 0xfeU >> 8 - bVar5);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)plVar13[1]);
          }
          append_count = local_58;
          append_sel = local_60;
          if (local_90.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
            append_count = local_58;
            append_sel = local_60;
          }
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != append_count);
  }
  return;
}

Assistant:

static void TupleDataTemplatedWithinCollectionScatter(const Vector &, const TupleDataVectorFormat &source_format,
                                                      const SelectionVector &append_sel, const idx_t append_count,
                                                      const TupleDataLayout &, const Vector &, Vector &heap_locations,
                                                      const idx_t, const UnifiedVectorFormat &list_data,
                                                      const vector<TupleDataScatterFunction> &) {
	// Parent list data
	const auto &list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto data = UnifiedVectorFormat::GetData<T>(source_data);
	const auto &source_validity = source_data.validity;

	// Target
	const auto target_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue; // Original list entry is invalid - no need to serialize the child
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip heap pointer over it
		auto &target_heap_location = target_heap_locations[i];
		ValidityBytes child_mask(target_heap_location, list_length);
		child_mask.SetAllValid(list_length);
		target_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto child_data_location = target_heap_location;
		target_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Store the data and validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_source_idx = source_sel.get_index(list_offset + child_i);
			if (source_validity.RowIsValid(child_source_idx)) {
				TupleDataWithinListValueStore<T>(data[child_source_idx],
				                                 child_data_location + child_i * TupleDataWithinListFixedSize<T>(),
				                                 target_heap_location);
			} else {
				child_mask.SetInvalidUnsafe(child_i);
			}
		}
	}
}